

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Double(Builder *this,double f)

{
  anon_union_8_3_83789bcb_for_Value_0 local_10;
  undefined4 local_8;
  uint local_4;
  
  local_8 = 3;
  local_4 = -(uint)((double)(float)f == f) & 1 ^ 3;
  local_10.f_ = f;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
  emplace_back<flexbuffers::Builder::Value>(&this->stack_,(Value *)&local_10);
  return;
}

Assistant:

void Double(double f) { stack_.push_back(Value(f)); }